

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_WriteCallExpr_Test::~ExprWriterTest_WriteCallExpr_Test
          (ExprWriterTest_WriteCallExpr_Test *this)

{
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            (&(this->super_ExprWriterTest).super_ExprFactory);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteCallExpr) {
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeConst(3),
      MakeBinary(ex::ADD, MakeVariable(0), MakeConst(5)),
      MakeConst(7),
      MakeVariable(1)
  };
  CHECK_WRITE("foo()", MakeCall(f, MakeArrayRef(args, 0)));
  CHECK_WRITE("foo(3)", MakeCall(f, MakeArrayRef(args, 1)));
  CHECK_WRITE("foo(3, x1 + 5, 7)", MakeCall(f, MakeArrayRef(args, 3)));
  CHECK_WRITE("foo(3, x1 + 5, 7, x2)", MakeCall(f, args));
}